

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O1

void multiple_perform_redo_proc(Am_Object *undo_handler)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object last_command;
  Am_Value_List command_list;
  Am_Object local_48;
  Am_Value_List local_40;
  Am_Value local_30;
  Am_Value local_20;
  Am_Object local_10;
  
  local_48.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(undo_handler,0x17a,0);
  Am_Object::operator=(&local_48,pAVar2);
  bVar1 = Am_Object::Valid(&local_48);
  if (bVar1) {
    Am_Value::Am_Value(&local_20,&Am_No_Value);
    Am_Value::Am_Value(&local_30,&Am_No_Value);
    am_perform_on_cmd_and_impls
              (&local_10,(Am_Slot_Key)&local_48,true,(Am_Value *)0x0,&local_20,SUB81(&local_30,0));
    Am_Object::~Am_Object(&local_10);
    Am_Value::~Am_Value(&local_30);
    Am_Value::~Am_Value(&local_20);
    Am_Value_List::Am_Value_List(&local_40);
    pAVar2 = Am_Object::Get(undo_handler,0xc5,4);
    Am_Value_List::operator=(&local_40,pAVar2);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_48);
    Am_Value_List::Add(&local_40,value,Am_HEAD,false);
    Am_Object::Note_Changed(undo_handler,0xc5);
    Am_Object::Set(undo_handler,0x17a,0,0);
    Am_Value_List::~Am_Value_List(&local_40);
    Am_Object::~Am_Object(&local_48);
    return;
  }
  Am_Error("No last command to Redo for Multiple Redo Handler");
}

Assistant:

Am_Define_Method(Am_Object_Method, void, multiple_perform_redo,
                 (Am_Object undo_handler))
{
  // if a pending last_command for Redo, then do it
  Am_Object last_command;
  last_command = undo_handler.Get(Am_LAST_UNDONE_COMMAND);
  if (!last_command.Valid())
    Am_Error("No last command to Redo for Multiple Redo Handler");
  else {
    am_perform_on_cmd_and_impls(last_command, Am_REDO_METHOD);

    // now put the last_command back on the undo list so can be undone
    Am_Value_List command_list;
    // we know list must exist, or else couldn't have done the first
    // undo, so don't have to check for it to exist here.
    command_list = undo_handler.Get(Am_COMMAND, Am_NO_DEPENDENCY);
    // push new one on the front.  false so don't copy the list
    command_list.Add(last_command, Am_HEAD, false);
    undo_handler.Note_Changed(Am_COMMAND); //destructively modified
    // clear out the last_command
    undo_handler.Set(Am_LAST_UNDONE_COMMAND, 0);
  }
}